

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O3

void __thiscall p2t::SweepContext::MeshClean(SweepContext *this,Triangle *triangle)

{
  pointer *pppTVar1;
  iterator __position;
  long lVar2;
  void *pvVar3;
  Triangle *t;
  vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> triangles;
  Triangle *local_60;
  void *local_58;
  void *pvStack_50;
  long local_48;
  Triangle *local_38;
  
  local_58 = (void *)0x0;
  pvStack_50 = (void *)0x0;
  local_48 = 0;
  local_60 = triangle;
  std::vector<p2t::Triangle*,std::allocator<p2t::Triangle*>>::emplace_back<p2t::Triangle*>
            ((vector<p2t::Triangle*,std::allocator<p2t::Triangle*>> *)&local_58,&local_60);
  pvVar3 = local_58;
  if (local_58 != pvStack_50) {
    do {
      local_60 = *(Triangle **)((long)pvStack_50 + -8);
      pvStack_50 = (void *)((long)pvStack_50 + -8);
      if ((local_60 != (Triangle *)0x0) && (local_60->interior_ == false)) {
        local_60->interior_ = true;
        __position._M_current =
             (this->triangles_).
             super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->triangles_).super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<p2t::Triangle*,std::allocator<p2t::Triangle*>>::
          _M_realloc_insert<p2t::Triangle*const&>
                    ((vector<p2t::Triangle*,std::allocator<p2t::Triangle*>> *)&this->triangles_,
                     __position,&local_60);
        }
        else {
          *__position._M_current = local_60;
          pppTVar1 = &(this->triangles_).
                      super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
        lVar2 = 4;
        do {
          if (local_60->constrained_edge[lVar2 + -4] == false) {
            local_38 = *(Triangle **)(local_60->constrained_edge + lVar2 * 8);
            std::vector<p2t::Triangle*,std::allocator<p2t::Triangle*>>::emplace_back<p2t::Triangle*>
                      ((vector<p2t::Triangle*,std::allocator<p2t::Triangle*>> *)&local_58,&local_38)
            ;
          }
          lVar2 = lVar2 + 1;
          pvVar3 = local_58;
        } while (lVar2 != 7);
      }
    } while (pvVar3 != pvStack_50);
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_48 - (long)pvVar3);
  }
  return;
}

Assistant:

void SweepContext::MeshClean(Triangle& triangle)
{
  std::vector<Triangle *> triangles;
  triangles.push_back(&triangle);

  while(!triangles.empty()){
	Triangle *t = triangles.back();
	triangles.pop_back();

    if (t != NULL && !t->IsInterior()) {
      t->IsInterior(true);
      triangles_.push_back(t);
      for (int i = 0; i < 3; i++) {
        if (!t->constrained_edge[i])
          triangles.push_back(t->GetNeighbor(i));
      }
    }
  }
}